

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall serialize_tests::varints::test_method(varints *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  iterator in_R8;
  iterator in_R9;
  long lVar5;
  uint n;
  ulong n_00;
  long in_FS_OFFSET;
  bool bVar6;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  int j;
  check_type cVar7;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  _func_int **local_190;
  _func_int **local_188;
  char *local_180;
  char *local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined1 *local_160;
  char *local_158;
  undefined1 local_150 [16];
  undefined ***local_140;
  _func_int ***local_138;
  assertion_result local_130;
  char *local_118;
  assertion_result local_110;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined ***local_88;
  _func_int ***local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  DataStream local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 0;
  n = 0;
  do {
    WriteVarInt<DataStream,(VarIntMode)1,int>(&local_58,n);
    lVar4 = 1;
    uVar1 = n;
    if (0x7f < n) {
      do {
        lVar4 = lVar4 + 1;
        bVar6 = 0x407f < uVar1;
        uVar1 = (uVar1 >> 7) - 1;
      } while (bVar6);
    }
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_60 = "";
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x71;
    file.m_begin = (iterator)&local_68;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
    lVar5 = lVar5 + lVar4;
    local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (lVar5 == (long)local_58.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_58.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos));
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_150._0_8_ = "size == ss.size()";
    local_150._8_8_ = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_88 = (undefined ***)boost::unit_test::lazy_ostream::inst;
    local_80 = (_func_int ***)local_150;
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_a0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_98,1,0,WARN,_cVar7,(size_t)&local_a8,0x71);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
    n = n + 1;
  } while (n != 100000);
  n_00 = 0;
  do {
    WriteVarInt<DataStream,(VarIntMode)0,unsigned_long>(&local_58,n_00);
    lVar4 = 1;
    for (uVar3 = n_00; 0x7f < uVar3; uVar3 = (uVar3 >> 7) - 1) {
      lVar4 = lVar4 + 1;
    }
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x77;
    file_00.m_begin = (iterator)&local_b8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,
               msg_00);
    lVar5 = lVar5 + lVar4;
    local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (lVar5 == (long)local_58.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_58.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos));
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_150._0_8_ = "size == ss.size()";
    local_150._8_8_ = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_88 = (undefined ***)boost::unit_test::lazy_ostream::inst;
    local_80 = (_func_int ***)local_150;
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_d0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_98,1,0,WARN,_cVar7,(size_t)&local_d8,0x77);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
    bVar6 = n_00 < 0x170cdc1e3f;
    n_00 = n_00 + 0x3b9ac9c1;
  } while (bVar6);
  local_188 = (_func_int **)((ulong)local_188 & 0xffffffff00000000);
  do {
    local_190._0_4_ = 0xffffffff;
    iVar2 = ReadVarInt<DataStream,(VarIntMode)1,int>(&local_58);
    local_190 = (_func_int **)CONCAT44(local_190._4_4_,iVar2);
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x7e;
    file_01.m_begin = (iterator)&local_e8;
    msg_01.m_end = in_R9;
    msg_01.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,
               msg_01);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)((int)local_188 == (int)local_190);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_168 = 0;
    local_170 = &PTR__lazy_ostream_013d8398;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "decoded:";
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150._0_8_ = &PTR__lazy_ostream_013d8498;
    local_140 = &local_170;
    local_138 = &local_190;
    local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
    local_130._0_8_ = &PTR__lazy_ostream_013d84d8;
    local_130.m_message.pn.pi_ = (sp_counted_base *)local_150;
    local_118 = " expected:";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d8518;
    local_88 = (undefined ***)&local_130;
    local_80 = &local_188;
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_178 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,&local_98,1,1,WARN,_cVar7,(size_t)&local_180,0x7e);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    iVar2 = (int)local_188;
    local_188 = (_func_int **)CONCAT44(local_188._4_4_,(int)local_188 + 1);
  } while (iVar2 < 99999);
  local_188 = (_func_int **)0x0;
  do {
    local_190 = (_func_int **)0xffffffffffffffff;
    local_190 = (_func_int **)ReadVarInt<DataStream,(VarIntMode)0,unsigned_long>(&local_58);
    local_1a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x84;
    file_02.m_begin = (iterator)&local_1a0;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
               msg_02);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_188 == local_190);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_168 = 0;
    local_170 = &PTR__lazy_ostream_013d8398;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "decoded:";
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150._0_8_ = &PTR__lazy_ostream_013d8558;
    local_140 = &local_170;
    local_138 = &local_190;
    local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
    local_130._0_8_ = &PTR__lazy_ostream_013d8598;
    local_130.m_message.pn.pi_ = (sp_counted_base *)local_150;
    local_118 = " expected:";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d85d8;
    local_88 = (undefined ***)&local_130;
    local_80 = &local_188;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,&local_98,1,1,WARN,0xf353a0,(size_t)&stack0xfffffffffffffe40,0x84);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    local_188 = (_func_int **)((long)local_188 + 0x3b9ac9c1);
  } while (local_188 < (_func_int **)0x174876e800);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(varints)
{
    // encode

    DataStream ss{};
    DataStream::size_type size = 0;
    for (int i = 0; i < 100000; i++) {
        ss << VARINT_MODE(i, VarIntMode::NONNEGATIVE_SIGNED);
        size += ::GetSerializeSize(VARINT_MODE(i, VarIntMode::NONNEGATIVE_SIGNED));
        BOOST_CHECK(size == ss.size());
    }

    for (uint64_t i = 0;  i < 100000000000ULL; i += 999999937) {
        ss << VARINT(i);
        size += ::GetSerializeSize(VARINT(i));
        BOOST_CHECK(size == ss.size());
    }

    // decode
    for (int i = 0; i < 100000; i++) {
        int j = -1;
        ss >> VARINT_MODE(j, VarIntMode::NONNEGATIVE_SIGNED);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }

    for (uint64_t i = 0;  i < 100000000000ULL; i += 999999937) {
        uint64_t j = std::numeric_limits<uint64_t>::max();
        ss >> VARINT(j);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }
}